

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

int __thiscall CChat::GetChatSound(CChat *this,int ChatType)

{
  int ChatType_local;
  CChat *this_local;
  undefined4 local_4;
  
  if (ChatType == 0) {
    local_4 = 0x20;
  }
  else if (ChatType == 1) {
    local_4 = 0x22;
  }
  else if (ChatType == 2) {
    local_4 = 0x21;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CChat::GetChatSound(int ChatType)
{
	switch(ChatType)
	{
		case CHAT_SERVER: return SOUND_CHAT_SERVER;
		case CHAT_HIGHLIGHT: return SOUND_CHAT_HIGHLIGHT;
		case CHAT_CLIENT: return SOUND_CHAT_CLIENT;
		default: return -1;
	}
}